

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void features::Sift::load_lowe_descriptors(string *filename,Descriptors *result)

{
  float *this;
  pointer pDVar1;
  istream *this_00;
  istream *piVar2;
  runtime_error *prVar3;
  int i;
  int iVar4;
  long lVar5;
  undefined1 local_450 [8];
  Descriptor descriptor;
  ifstream in;
  int aiStack_220 [122];
  int local_38;
  int local_34;
  int num_dimensions;
  int num_descriptors;
  
  this = descriptor.data.v + 0x7e;
  std::ifstream::ifstream(this,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_220 + *(long *)(descriptor.data.v._504_8_ + -0x18)) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Cannot open descriptor file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (istream *)std::istream::operator>>((istream *)(descriptor.data.v + 0x7e),&local_34);
  std::istream::operator>>(this_00,&local_38);
  if (((long)local_34 < 0x186a1) && (local_38 == 0x80)) {
    pDVar1 = (result->
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((result->
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>)
        ._M_impl.super__Vector_impl_data._M_finish != pDVar1) {
      (result->
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar1;
    }
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              (result,(long)local_34);
    for (iVar4 = 0; iVar4 < local_34; iVar4 = iVar4 + 1) {
      piVar2 = std::istream::_M_extract<float>(this);
      piVar2 = std::istream::_M_extract<float>((float *)piVar2);
      piVar2 = std::istream::_M_extract<float>((float *)piVar2);
      std::istream::_M_extract<float>((float *)piVar2);
      for (lVar5 = 0x10; lVar5 != 0x210; lVar5 = lVar5 + 4) {
        std::istream::_M_extract<float>(this);
      }
      math::Vector<float,_128>::normalize((Vector<float,_128> *)&descriptor.scale);
      std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
      push_back(result,(value_type *)local_450);
    }
    if (*(int *)((long)aiStack_220 + *(long *)(descriptor.data.v._504_8_ + -0x18)) == 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(descriptor.data.v + 0x7e);
      return;
    }
    pDVar1 = (result->
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((result->
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>)
        ._M_impl.super__Vector_impl_data._M_finish != pDVar1) {
      (result->
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar1;
    }
    std::ifstream::close();
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Error while reading descriptors");
  }
  else {
    std::ifstream::close();
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Invalid number of descriptors/dimensions");
  }
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Sift::load_lowe_descriptors (std::string const& filename, Descriptors* result)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw std::runtime_error("Cannot open descriptor file");

    int num_descriptors;
    int num_dimensions;
    in >> num_descriptors >> num_dimensions;
    if (num_descriptors > 100000 || num_dimensions != 128)
    {
        in.close();
        throw std::runtime_error("Invalid number of descriptors/dimensions");
    }
    result->clear();
    result->reserve(num_descriptors);
    for (int i = 0; i < num_descriptors; ++i)
    {
        Sift::Descriptor descriptor;
        in >> descriptor.y >> descriptor.x
            >> descriptor.scale >> descriptor.orientation;
        for (int j = 0; j < 128; ++j)
            in >> descriptor.data[j];
        descriptor.data.normalize();
        result->push_back(descriptor);
    }

    if (!in.good())
    {
        result->clear();
        in.close();
        throw std::runtime_error("Error while reading descriptors");
    }

    in.close();
}